

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strtoupper(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 in_RAX;
  char *pcVar1;
  ushort **ppuVar2;
  __int32_t **pp_Var3;
  long lVar4;
  char *zString;
  uint uVar5;
  int c;
  int nLen;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    _c = in_RAX;
    pcVar1 = jx9_value_to_string(*apArg,&nLen);
    lVar4 = (long)nLen;
    if (lVar4 < 1) {
      jx9_result_string(pCtx,"",0);
    }
    else {
      zString = pcVar1;
      while (zString < pcVar1 + lVar4) {
        uVar5 = (uint)*zString;
        if (uVar5 < 0xffffffc0) {
          _c = CONCAT44(nLen,uVar5);
          ppuVar2 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar2 + (long)(int)uVar5 * 2 + 1) & 2) != 0) {
            pp_Var3 = __ctype_toupper_loc();
            _c = CONCAT44(nLen,(*pp_Var3)[*zString]);
          }
          jx9_result_string(pCtx,(char *)&c,1);
          zString = zString + 1;
        }
        else {
          jx9_result_string(pCtx,zString,1);
          zString = zString + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strtoupper(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zCur, *zEnd;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	zEnd = &zString[nLen];
	for(;;){
		if( zString >= zEnd ){
			/* No more input, break immediately */
			break;
		}
		if( (unsigned char)zString[0] >= 0xc0 ){
			/* UTF-8 stream, output verbatim */
			zCur = zString;
			zString++;
			while( zString < zEnd && ((unsigned char)zString[0] & 0xc0) == 0x80){
				zString++;
			}
			/* Append UTF-8 stream */
			jx9_result_string(pCtx, zCur, (int)(zString-zCur));
		}else{
			int c = zString[0];
			if( SyisLower(c) ){
				c = SyToUpper(zString[0]);
			}
			/* Append character */
			jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			/* Advance the cursor */
			zString++;
		}
	}
	return JX9_OK;
}